

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::readObject(QPDF *this,string *description,QPDFObjGen og)

{
  pointer pcVar1;
  InputSource *this_00;
  bool bVar2;
  qpdf_offset_t qVar3;
  QPDFObjGen in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  StringDecrypter *decrypter_00;
  QPDFObjectHandle QVar4;
  Token token;
  StringDecrypter decrypter;
  allocator<char> local_169;
  pair<QPDFObjectHandle,_bool> local_168;
  string local_150;
  QPDFExc local_130;
  Token local_b0;
  StringDecrypter local_48;
  
  setLastObjectDescription((QPDF *)description,(string *)og,in_RCX);
  qVar3 = (**(code **)(**(long **)((description->_M_dataplus)._M_p + 0xb0) + 0x20))();
  StringDecrypter::StringDecrypter(&local_48,(QPDF *)description,in_RCX);
  pcVar1 = (description->_M_dataplus)._M_p;
  decrypter_00 = (StringDecrypter *)0x0;
  if (**(char **)(pcVar1 + 0x108) != '\0') {
    decrypter_00 = &local_48;
  }
  QPDFParser::parse(&local_168,*(InputSource **)(pcVar1 + 0xb0),(string *)(pcVar1 + 0xc0),
                    (Tokenizer *)(pcVar1 + 0x18),&decrypter_00->super_StringDecrypter,
                    (QPDF *)description);
  if (local_168.second == true) {
    this_00 = *(InputSource **)((description->_M_dataplus)._M_p + 0xb0);
    qVar3 = InputSource::getLastOffset(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"empty object treated as null",(allocator<char> *)&local_150);
    damagedPDF(&local_130,(QPDF *)description,this_00,qVar3,(string *)&local_b0);
    warn((QPDF *)description,&local_130);
    QPDFExc::~QPDFExc(&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
  }
  else {
    readToken(&local_b0,(QPDF *)description,
              *(InputSource **)((description->_M_dataplus)._M_p + 0xb0),0);
    bVar2 = QPDFObjectHandle::isDictionary(&local_168.first);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"stream",(allocator<char> *)&local_150);
      bVar2 = QPDFTokenizer::Token::isWord(&local_b0,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if (bVar2) {
        readStream((QPDF *)description,&local_168.first,in_RCX,qVar3);
        readToken((Token *)&local_130,(QPDF *)description,
                  *(InputSource **)((description->_M_dataplus)._M_p + 0xb0),0);
        QPDFTokenizer::Token::operator=(&local_b0,(Token *)&local_130);
        QPDFTokenizer::Token::~Token((Token *)&local_130);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"endobj",(allocator<char> *)&local_150);
    bVar2 = QPDFTokenizer::Token::isWord(&local_b0,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"expected endobj",&local_169);
      damagedPDF(&local_130,(QPDF *)description,&local_150);
      warn((QPDF *)description,&local_130);
      QPDFExc::~QPDFExc(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
    QPDFTokenizer::Token::~Token(&local_b0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.first.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObject(std::string const& description, QPDFObjGen og)
{
    setLastObjectDescription(description, og);
    qpdf_offset_t offset = m->file->tell();

    StringDecrypter decrypter{this, og};
    StringDecrypter* decrypter_ptr = m->encp->encrypted ? &decrypter : nullptr;
    auto [object, empty] =
        QPDFParser::parse(*m->file, m->last_object_description, m->tokenizer, decrypter_ptr, *this);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF(*m->file, m->file->getLastOffset(), "empty object treated as null"));
        return object;
    }
    auto token = readToken(*m->file);
    if (object.isDictionary() && token.isWord("stream")) {
        readStream(object, og, offset);
        token = readToken(*m->file);
    }
    if (!token.isWord("endobj")) {
        QTC::TC("qpdf", "QPDF err expected endobj");
        warn(damagedPDF("expected endobj"));
    }
    return object;
}